

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  cmake *pcVar7;
  ulong uVar8;
  ulong uVar9;
  cmExecutionStatus status;
  MessageType messType;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileContext conditionContext;
  cmListFileBacktrace bt;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_190;
  MessageType local_18c;
  string local_188;
  cmExecutionStatus *local_168;
  undefined1 local_160 [32];
  cmMakefile *local_140;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_138;
  cmListFileContext local_120;
  string *local_d8;
  cmListFileBacktrace local_d0;
  cmMakefile *local_b0;
  
  iVar3 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"if");
  if (iVar3 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar3 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif")
    ;
    if (iVar3 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffff50,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (local_b0 == (cmMakefile *)0x0) {
          return false;
        }
        local_140 = local_b0;
        local_190.ReturnInvoked = false;
        local_190.BreakInvoked = false;
        local_190.ContinueInvoked = false;
        local_190.NestedError = false;
        pcVar6 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_168 = inStatus;
        if ((this->Functions).
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar6) {
          local_d8 = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
          iVar3 = 0;
          uVar8 = 0;
          uVar9 = 1;
          do {
            iVar4 = cmsys::SystemTools::Strucmp
                              (pcVar6[uVar8].super_cmCommandContext.Name._M_dataplus._M_p,"if");
            iVar5 = cmsys::SystemTools::Strucmp
                              ((this->Functions).
                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar8].
                               super_cmCommandContext.Name._M_dataplus._M_p,"endif");
            iVar3 = (iVar3 + (uint)(iVar4 == 0)) - (uint)(iVar5 == 0);
            if (iVar3 == 0) {
              iVar4 = cmsys::SystemTools::Strucmp
                                ((this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                 super_cmCommandContext.Name._M_dataplus._M_p,"else");
              if (iVar4 == 0) {
                if (this->ElseSeen == true) {
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)&stack0xffffffffffffff50,mf,
                             &(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super_cmCommandContext);
                  pcVar7 = cmMakefile::GetCMakeInstance(mf);
                  local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_120,
                             "A duplicate ELSE command was found inside an IF block.","");
                  cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_120.Name,
                                      (cmListFileBacktrace *)&stack0xffffffffffffff50);
LAB_003ed85a:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_120.Name._M_dataplus._M_p != &local_120.Name.field_2) {
                    operator_delete(local_120.Name._M_dataplus._M_p,
                                    local_120.Name.field_2._M_allocated_capacity + 1);
                  }
                  cmSystemTools::s_FatalErrorOccured = true;
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)&stack0xffffffffffffff50);
                  break;
                }
                bVar2 = this->HasRun;
                this->IsBlocking = bVar2;
                this->HasRun = true;
                this->ElseSeen = true;
                if ((bVar2 == false) &&
                   (pcVar7 = cmMakefile::GetCMakeInstance(mf), pcVar7->Trace == true)) {
                  cmMakefile::PrintCommandTrace
                            (mf,(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar8);
                }
              }
              else {
                iVar4 = cmsys::SystemTools::Strucmp
                                  ((this->Functions).
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                   super_cmCommandContext.Name._M_dataplus._M_p,"elseif");
                if (iVar4 != 0) goto LAB_003ed46a;
                if (this->ElseSeen == true) {
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)&stack0xffffffffffffff50,mf,
                             &(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super_cmCommandContext);
                  pcVar7 = cmMakefile::GetCMakeInstance(mf);
                  local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_120,
                             "An ELSEIF command was found after an ELSE command.","");
                  cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_120.Name,
                                      (cmListFileBacktrace *)&stack0xffffffffffffff50);
                  goto LAB_003ed85a;
                }
                if (this->HasRun == true) {
                  this->IsBlocking = true;
                }
                else {
                  pcVar7 = cmMakefile::GetCMakeInstance(mf);
                  if (pcVar7->Trace == true) {
                    cmMakefile::PrintCommandTrace
                              (mf,(this->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar8);
                  }
                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  local_188._M_string_length = 0;
                  local_188.field_2._M_local_buf[0] = '\0';
                  local_138.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_138.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_138.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  cmMakefile::ExpandArguments
                            (mf,&(this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].Arguments,
                             &local_138,(char *)0x0);
                  cmListFileContext::FromCommandContext
                            (&local_120,
                             &(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super_cmCommandContext,local_d8);
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)local_160,mf,
                             &(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super_cmCommandContext);
                  cmConditionEvaluator::cmConditionEvaluator
                            ((cmConditionEvaluator *)&stack0xffffffffffffff50,mf,&local_120,
                             (cmListFileBacktrace *)local_160);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_160);
                  bVar2 = cmConditionEvaluator::IsTrue
                                    ((cmConditionEvaluator *)&stack0xffffffffffffff50,&local_138,
                                     &local_188,&local_18c);
                  if (local_188._M_string_length != 0) {
                    cmIfCommandError_abi_cxx11_((string *)local_160,&local_138);
                    std::__cxx11::string::_M_append
                              ((char *)local_160,(ulong)local_188._M_dataplus._M_p);
                    cmMakefile::GetBacktrace
                              (&local_d0,mf,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                super_cmCommandContext);
                    pcVar7 = cmMakefile::GetCMakeInstance(mf);
                    cmake::IssueMessage(pcVar7,local_18c,(string *)local_160,&local_d0);
                    if (local_18c == FATAL_ERROR) {
                      cmSystemTools::s_FatalErrorOccured = true;
                      cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
                      if ((cmState *)local_160._0_8_ != (cmState *)(local_160 + 0x10)) {
                        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
                      }
                      cmConditionEvaluator::~cmConditionEvaluator
                                ((cmConditionEvaluator *)&stack0xffffffffffffff50);
                      cmListFileContext::~cmListFileContext(&local_120);
                      std::
                      vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ::~vector(&local_138);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_188._M_dataplus._M_p != &local_188.field_2) {
                        operator_delete(local_188._M_dataplus._M_p,
                                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                                 local_188.field_2._M_local_buf[0]) + 1);
                      }
                      break;
                    }
                    cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
                    if ((cmState *)local_160._0_8_ != (cmState *)(local_160 + 0x10)) {
                      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
                    }
                  }
                  if (bVar2) {
                    this->IsBlocking = false;
                    this->HasRun = true;
                  }
                  cmConditionEvaluator::~cmConditionEvaluator
                            ((cmConditionEvaluator *)&stack0xffffffffffffff50);
                  cmListFileContext::~cmListFileContext(&local_120);
                  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ::~vector(&local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                             local_188.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
            }
            else {
LAB_003ed46a:
              if (this->IsBlocking == false) {
                local_190.ReturnInvoked = false;
                local_190.BreakInvoked = false;
                local_190.ContinueInvoked = false;
                local_190.NestedError = false;
                cmMakefile::ExecuteCommand
                          (mf,(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar8,&local_190);
                if (local_190.ReturnInvoked == true) {
                  local_168->ReturnInvoked = true;
                  break;
                }
                if (local_190.BreakInvoked == true) {
                  local_168->BreakInvoked = true;
                  break;
                }
                if (local_190.ContinueInvoked == true) {
                  local_168->ContinueInvoked = true;
                  break;
                }
              }
            }
            pcVar6 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            bVar2 = uVar9 < (ulong)((long)(this->Functions).
                                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar6
                                   >> 6);
            uVar8 = uVar9;
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (bVar2);
        }
        (**(code **)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_140->FindPackageModuleStack).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map)->field_2 + 8))();
        return true;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "if")) {
    this->ScopeDepth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (unsigned int c = 0; c < this->Functions.size(); ++c) {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "if")) {
          scopeDepth++;
        }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                    "endif")) {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "else")) {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(this->Functions[c]);
          }
        } else if (scopeDepth == 0 &&
                   !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                           "elseif")) {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(this->Functions[c]);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                this->Functions[c], this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
              mf, conditionContext, mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}